

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O2

string * __thiscall
args::ArgumentParser::
ParseArgsValues<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
          (string *__return_storage_ptr__,ArgumentParser *this,FlagBase *flag,string *arg,
          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *it,__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              end,bool allowSeparate,bool allowJoined,bool hasJoined,string *joinedArg,
          bool canDiscardJoined,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *values)

{
  bool bVar1;
  int iVar2;
  OptionType OVar3;
  undefined4 extraout_var;
  ulong uVar4;
  ulong uVar5;
  ulong extraout_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  it_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  ulong local_d8;
  string local_d0;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(values);
  iVar2 = (*(flag->super_NamedBase).super_Base._vptr_Base[0x13])(flag);
  uVar4 = CONCAT44(extraout_var,iVar2);
  if (((!hasJoined) || (allowJoined)) || (uVar4 == 0)) {
    local_d8 = uVar4;
    if (hasJoined) {
      if ((!canDiscardJoined) || (extraout_RDX != 0)) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(values,joinedArg);
      }
    }
    else if (allowSeparate) {
      it_00 = (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               )it->_M_current;
      while (((it_00._M_current = it_00._M_current + 1, it_00._M_current != end._M_current &&
              (uVar4 = (long)(values->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish -
                       (long)(values->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start >> 5, uVar4 < extraout_RDX))
             && ((uVar4 < local_d8 ||
                 (OVar3 = ParseOption(this,it_00._M_current,false), OVar3 == Positional))))) {
        bVar1 = Complete<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                          (this,flag,it_00,end);
        if (bVar1) {
          it->_M_current = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)end;
          std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&local_f8);
          return __return_storage_ptr__;
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(values,it_00._M_current);
        it->_M_current = it->_M_current + 1;
      }
    }
    else if (uVar4 != 0) {
      std::operator+(&local_f8,"Flag \'",arg);
      std::operator+(__return_storage_ptr__,&local_f8,
                     "\' was passed a separate argument, but these are disallowed");
      goto LAB_0010e54b;
    }
    uVar4 = local_d8;
    uVar5 = (long)(values->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish -
            (long)(values->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start >> 5;
    if (extraout_RDX < uVar5) {
      std::operator+(__return_storage_ptr__,"Passed an argument into a non-argument flag: ",arg);
      return __return_storage_ptr__;
    }
    if (local_d8 <= uVar5) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
      return __return_storage_ptr__;
    }
    if (extraout_RDX == 1 && local_d8 == 1) {
      std::operator+(&local_f8,"Flag \'",arg);
      std::operator+(__return_storage_ptr__,&local_f8,"\' requires an argument but received none");
    }
    else {
      if (local_d8 != 1) {
        if (local_d8 == extraout_RDX) {
          std::operator+(&local_50,"Flag \'",arg);
          std::operator+(&local_90,&local_50,"\' requires ");
          std::__cxx11::to_string(&local_b0,uVar4);
          std::operator+(&local_70,&local_90,&local_b0);
          std::operator+(&local_f8,&local_70," arguments but received ");
          std::__cxx11::to_string
                    (&local_d0,
                     (long)(values->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish -
                     (long)(values->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start >> 5);
          std::operator+(__return_storage_ptr__,&local_f8,&local_d0);
        }
        else {
          std::operator+(&local_50,"Flag \'",arg);
          std::operator+(&local_90,&local_50,"\' requires at least ");
          std::__cxx11::to_string(&local_b0,uVar4);
          std::operator+(&local_70,&local_90,&local_b0);
          std::operator+(&local_f8,&local_70," arguments but received ");
          std::__cxx11::to_string
                    (&local_d0,
                     (long)(values->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish -
                     (long)(values->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start >> 5);
          std::operator+(__return_storage_ptr__,&local_f8,&local_d0);
        }
        std::__cxx11::string::~string((string *)&local_d0);
        std::__cxx11::string::~string((string *)&local_f8);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_b0);
        std::__cxx11::string::~string((string *)&local_90);
        this_00 = &local_50;
        goto LAB_0010e550;
      }
      std::operator+(&local_f8,"Flag \'",arg);
      std::operator+(__return_storage_ptr__,&local_f8,
                     "\' requires at least one argument but received none");
    }
  }
  else {
    std::operator+(&local_f8,"Flag \'",arg);
    std::operator+(__return_storage_ptr__,&local_f8,
                   "\' was passed a joined argument, but these are disallowed");
  }
LAB_0010e54b:
  this_00 = &local_f8;
LAB_0010e550:
  std::__cxx11::string::~string((string *)this_00);
  return __return_storage_ptr__;
}

Assistant:

std::string ParseArgsValues(FlagBase &flag, const std::string &arg, It &it, It end,
                                        const bool allowSeparate, const bool allowJoined,
                                        const bool hasJoined, const std::string &joinedArg,
                                        const bool canDiscardJoined, std::vector<std::string> &values)
            {
                values.clear();

                Nargs nargs = flag.NumberOfArguments();

                if (hasJoined && !allowJoined && nargs.min != 0)
                {
                    return "Flag '" + arg + "' was passed a joined argument, but these are disallowed";
                }

                if (hasJoined)
                {
                    if (!canDiscardJoined || nargs.max != 0)
                    {
                        values.push_back(joinedArg);
                    }
                } else if (!allowSeparate)
                {
                    if (nargs.min != 0)
                    {
                        return "Flag '" + arg + "' was passed a separate argument, but these are disallowed";
                    }
                } else
                {
                    auto valueIt = it;
                    ++valueIt;

                    while (valueIt != end &&
                           values.size() < nargs.max &&
                           (values.size() < nargs.min || ParseOption(*valueIt) == OptionType::Positional))
                    {
                        if (Complete(flag, valueIt, end))
                        {
                            it = end;
                            return "";
                        }

                        values.push_back(*valueIt);
                        ++it;
                        ++valueIt;
                    }
                }

                if (values.size() > nargs.max)
                {
                    return "Passed an argument into a non-argument flag: " + arg;
                } else if (values.size() < nargs.min)
                {
                    if (nargs.min == 1 && nargs.max == 1)
                    {
                        return "Flag '" + arg + "' requires an argument but received none";
                    } else if (nargs.min == 1)
                    {
                        return "Flag '" + arg + "' requires at least one argument but received none";
                    } else if (nargs.min != nargs.max)
                    {
                        return "Flag '" + arg + "' requires at least " + std::to_string(nargs.min) +
                               " arguments but received " + std::to_string(values.size());
                    } else
                    {
                        return "Flag '" + arg + "' requires " + std::to_string(nargs.min) +
                               " arguments but received " + std::to_string(values.size());
                    }
                }

                return {};
            }